

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void rollback_and_snapshot_test(void)

{
  fdb_encryption_key *fconfig;
  void *pvVar1;
  fdb_doc *doc;
  fdb_status fVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  fdb_kvs_handle *handle;
  fdb_kvs_handle *doc_00;
  int iVar6;
  fdb_config *fconfig_00;
  fdb_seqnum_t fVar7;
  fdb_kvs_handle *pfVar8;
  uint uVar9;
  char *pcVar10;
  long lVar11;
  fdb_kvs_handle *pfVar12;
  fdb_kvs_handle *pfVar13;
  ulong uVar14;
  fdb_kvs_handle *config;
  fdb_kvs_config *config_00;
  char *pcVar15;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *snapshot;
  size_t vallen;
  void *val;
  fdb_kvs_info kvs_info;
  timeval __test_begin;
  fdb_iterator *pfStack_f20;
  fdb_doc *pfStack_f18;
  fdb_kvs_handle *pfStack_f10;
  timeval tStack_f08;
  char acStack_ef8 [256];
  char acStack_df8 [264];
  fdb_kvs_handle *pfStack_cf0;
  fdb_kvs_handle *pfStack_ce8;
  fdb_kvs_handle *pfStack_ce0;
  fdb_kvs_config *pfStack_cd8;
  fdb_kvs_handle *pfStack_cd0;
  fdb_kvs_handle *pfStack_cc8;
  fdb_kvs_handle *pfStack_cb8;
  fdb_custom_cmp_variable p_Stack_cb0;
  fdb_kvs_handle *pfStack_ca8;
  fdb_kvs_handle *pfStack_ca0;
  fdb_kvs_handle *pfStack_c98;
  kvs_ops_stat *pkStack_c90;
  hbtrie *phStack_c88;
  hbtrie *phStack_c80;
  fdb_kvs_config fStack_c78;
  timeval tStack_c60;
  undefined1 auStack_c50 [512];
  fdb_config fStack_a50;
  fdb_kvs_handle *pfStack_958;
  fdb_kvs_handle *pfStack_950;
  fdb_kvs_handle *pfStack_948;
  fdb_kvs_handle *pfStack_940;
  fdb_kvs_handle *pfStack_938;
  fdb_kvs_handle *pfStack_930;
  undefined1 auStack_918 [16];
  fdb_kvs_handle *pfStack_908;
  fdb_file_handle *pfStack_900;
  undefined1 auStack_8f8 [40];
  undefined1 auStack_8d0 [280];
  undefined1 auStack_7b8 [336];
  timeval tStack_668;
  fdb_kvs_handle fStack_658;
  fdb_kvs_handle *pfStack_450;
  ulong uStack_448;
  fdb_kvs_handle **ppfStack_440;
  fdb_kvs_handle *pfStack_438;
  fdb_kvs_handle *pfStack_428;
  fdb_file_handle *pfStack_420;
  fdb_kvs_handle *pfStack_418;
  undefined1 auStack_410 [64];
  fdb_kvs_config fStack_3d0;
  fdb_config fStack_3b8;
  char acStack_2c0 [264];
  fdb_config *pfStack_1b8;
  fdb_kvs_handle *local_180;
  fdb_file_handle *local_178;
  fdb_kvs_handle *local_170;
  size_t local_168;
  void *local_160;
  fdb_kvs_info local_158;
  fdb_kvs_config local_128;
  timeval local_110;
  fdb_config local_100;
  
  gettimeofday(&local_110,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_00 = &local_100;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fVar2 = fdb_open(&local_178,"mvcc_test",fconfig_00);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_kvs_open(local_178,&local_180,(char *)0x0,&local_128);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00116cdb;
    fVar2 = fdb_set_kv(local_180,"a",1,"val-a",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00116ce0;
    fVar2 = fdb_commit(local_178,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00116ce5;
    fVar2 = fdb_get_kvs_info(local_180,&local_158);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00116cea;
    fVar2 = fdb_set_kv(local_180,"b",1,"val-b",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00116cef;
    fVar2 = fdb_commit(local_178,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00116cf4;
    fVar2 = fdb_get_kvs_info(local_180,&local_158);
    fVar7 = local_158.last_seqnum;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00116cf9;
    fVar2 = fdb_set_kv(local_180,"c",1,"val-c",5);
    fconfig_00 = (fdb_config *)fVar7;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00116cfe;
    fVar2 = fdb_commit(local_178,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00116d03;
    fVar2 = fdb_get_kvs_info(local_180,&local_158);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00116d08;
    fVar2 = fdb_rollback(&local_180,fVar7);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00116d0d;
    fVar2 = fdb_get_kvs_info(local_180,&local_158);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00116d12;
    fVar2 = fdb_get_kv(local_180,"c",1,&local_160,&local_168);
    fconfig_00 = (fdb_config *)local_158.last_seqnum;
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00116d17;
    fVar2 = fdb_snapshot_open(local_180,&local_170,local_158.last_seqnum);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00116d1c;
    fVar2 = fdb_get_kv(local_170,"c",1,&local_160,&local_168);
    if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
      fdb_kvs_close(local_170);
      fdb_close(local_178);
      fdb_shutdown();
      memleak_end();
      pcVar10 = "%s PASSED\n";
      if (rollback_and_snapshot_test()::__test_pass != '\0') {
        pcVar10 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar10,"rollback and snapshot test");
      return;
    }
  }
  else {
    rollback_and_snapshot_test();
LAB_00116cdb:
    rollback_and_snapshot_test();
LAB_00116ce0:
    rollback_and_snapshot_test();
LAB_00116ce5:
    rollback_and_snapshot_test();
LAB_00116cea:
    rollback_and_snapshot_test();
LAB_00116cef:
    rollback_and_snapshot_test();
LAB_00116cf4:
    rollback_and_snapshot_test();
LAB_00116cf9:
    rollback_and_snapshot_test();
LAB_00116cfe:
    rollback_and_snapshot_test();
LAB_00116d03:
    rollback_and_snapshot_test();
LAB_00116d08:
    rollback_and_snapshot_test();
LAB_00116d0d:
    rollback_and_snapshot_test();
LAB_00116d12:
    rollback_and_snapshot_test();
LAB_00116d17:
    rollback_and_snapshot_test();
LAB_00116d1c:
    rollback_and_snapshot_test();
  }
  rollback_and_snapshot_test();
  pfStack_438 = (fdb_kvs_handle *)0x116d43;
  pfStack_1b8 = fconfig_00;
  gettimeofday((timeval *)(auStack_410 + 0x30),(__timezone_ptr_t)0x0);
  pfStack_438 = (fdb_kvs_handle *)0x116d48;
  memleak_start();
  pfStack_438 = (fdb_kvs_handle *)0x116d55;
  fdb_get_default_config();
  pfStack_438 = (fdb_kvs_handle *)0x116d62;
  fdb_get_default_kvs_config();
  pfStack_438 = (fdb_kvs_handle *)0x116d6e;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fStack_3b8.wal_threshold = 0x400;
  fStack_3b8.flags = 1;
  fStack_3b8.compaction_threshold = '\0';
  fStack_3b8.block_reusing_threshold = 0;
  pfStack_438 = (fdb_kvs_handle *)0x116da5;
  fdb_open(&pfStack_420,"./mvcc_test1",&fStack_3b8);
  pfStack_438 = (fdb_kvs_handle *)0x116dbc;
  fdb_kvs_open(pfStack_420,&pfStack_428,"kv1",&fStack_3d0);
  pfStack_438 = (fdb_kvs_handle *)0x116dce;
  fdb_kvs_open(pfStack_420,&pfStack_418,(char *)0x0,&fStack_3d0);
  pfVar13 = (fdb_kvs_handle *)auStack_410;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    iVar6 = 0;
    do {
      pfStack_438 = (fdb_kvs_handle *)0x116df7;
      sprintf(acStack_2c0,"key%02d%03d",doc_00);
      pfVar12 = pfStack_428;
      pfStack_438 = (fdb_kvs_handle *)0x116e04;
      sVar3 = strlen(acStack_2c0);
      pfStack_438 = (fdb_kvs_handle *)0x116e17;
      fdb_set_kv(pfVar12,acStack_2c0,sVar3,(void *)0x0,0);
      pfVar12 = pfStack_418;
      pfStack_438 = (fdb_kvs_handle *)0x116e24;
      sVar3 = strlen(acStack_2c0);
      pfStack_438 = (fdb_kvs_handle *)0x116e37;
      fdb_set_kv(pfVar12,acStack_2c0,sVar3,(void *)0x0,0);
      iVar6 = iVar6 + 1;
    } while (iVar6 != 100);
    pfStack_438 = (fdb_kvs_handle *)0x116e4d;
    fdb_commit(pfStack_420,(byte)doc_00 & 1);
    pfStack_438 = (fdb_kvs_handle *)0x116e5a;
    fdb_get_kvs_info(pfStack_428,(fdb_kvs_info *)pfVar13);
    if (auStack_410._16_8_ != auStack_410._8_8_) {
      pfStack_438 = (fdb_kvs_handle *)0x116e82;
      rollback_ncommits();
    }
    uVar9 = (int)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar9;
  } while (uVar9 != 10);
  uVar14 = 0xb;
  fVar7 = 1000;
  pfVar12 = (fdb_kvs_handle *)auStack_410;
  while( true ) {
    pfStack_438 = (fdb_kvs_handle *)0x116ea4;
    fVar2 = fdb_rollback(&pfStack_428,fVar7);
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    pfStack_438 = (fdb_kvs_handle *)0x116eb9;
    fdb_get_kvs_info(pfStack_428,(fdb_kvs_info *)pfVar12);
    if (auStack_410._16_8_ != auStack_410._8_8_) {
      pfStack_438 = (fdb_kvs_handle *)0x116ee3;
      rollback_ncommits();
    }
    uVar14 = uVar14 - 1;
    fVar7 = fVar7 - 100;
    if (uVar14 < 2) {
      pfStack_438 = (fdb_kvs_handle *)0x116eef;
      fdb_kvs_close(pfStack_428);
      pfStack_438 = (fdb_kvs_handle *)0x116ef9;
      fdb_close(pfStack_420);
      pfStack_438 = (fdb_kvs_handle *)0x116efe;
      fdb_shutdown();
      pfStack_438 = (fdb_kvs_handle *)0x116f03;
      memleak_end();
      pcVar10 = "%s PASSED\n";
      if (rollback_ncommits()::__test_pass != '\0') {
        pcVar10 = "%s FAILED\n";
      }
      pfStack_438 = (fdb_kvs_handle *)0x116f34;
      fprintf(_stderr,pcVar10,"rollback n commits");
      return;
    }
  }
  pfStack_438 = (fdb_kvs_handle *)transaction_test;
  rollback_ncommits();
  pfStack_930 = (fdb_kvs_handle *)0x116f6b;
  fStack_658.bub_ctx.space_used = fVar7;
  fStack_658.bub_ctx.handle = pfVar12;
  pfStack_450 = pfVar13;
  uStack_448 = uVar14;
  ppfStack_440 = &pfStack_428;
  pfStack_438 = doc_00;
  gettimeofday(&tStack_668,(__timezone_ptr_t)0x0);
  pfStack_930 = (fdb_kvs_handle *)0x116f70;
  memleak_start();
  pfStack_930 = (fdb_kvs_handle *)0x116f7c;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_930 = (fdb_kvs_handle *)0x116f8c;
  fdb_get_default_config();
  config = (fdb_kvs_handle *)auStack_8d0;
  pfStack_930 = (fdb_kvs_handle *)0x116f99;
  fdb_get_default_kvs_config();
  fStack_658.config.encryption_key.bytes[4] = '\0';
  fStack_658.config.encryption_key.bytes[5] = '\0';
  fStack_658.config.encryption_key.bytes[6] = '\0';
  fStack_658.config.encryption_key.bytes[7] = '\0';
  fStack_658.config.encryption_key.bytes[8] = '\0';
  fStack_658.config.encryption_key.bytes[9] = '\0';
  fStack_658.config.encryption_key.bytes[10] = '\0';
  fStack_658.config.encryption_key.bytes[0xb] = '\0';
  fStack_658.config.encryption_key.bytes[0xc] = '\0';
  fStack_658.config.encryption_key.bytes[0xd] = '\x04';
  fStack_658.config.encryption_key.bytes[0xe] = '\0';
  fStack_658.config.encryption_key.bytes[0xf] = '\0';
  fStack_658.config.encryption_key.bytes[0x10] = '\0';
  fStack_658.config.encryption_key.bytes[0x11] = '\0';
  fStack_658.config.encryption_key.bytes[0x12] = '\0';
  fStack_658.config.encryption_key.bytes[0x13] = '\0';
  fStack_658.config._180_4_ = 1;
  fStack_658.config.encryption_key.bytes[0x18] = '\0';
  fStack_658.config.encryption_key.bytes[0x19] = '\0';
  fStack_658.config.encryption_key.bytes[0x1a] = '\0';
  fStack_658.config.encryption_key.bytes[0x1b] = '\0';
  fStack_658.config.block_reusing_threshold._7_1_ = 0;
  pfVar8 = (fdb_kvs_handle *)auStack_8f8;
  pfStack_930 = (fdb_kvs_handle *)0x116fd2;
  fdb_open((fdb_file_handle **)pfVar8,"mvcc_test1",(fdb_config *)&fStack_658.config.encryption_key);
  pcVar10 = auStack_918 + 8;
  pfStack_930 = (fdb_kvs_handle *)0x116fe5;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_8f8._0_8_,(fdb_kvs_handle **)pcVar10,
             (fdb_kvs_config *)config);
  pfStack_930 = (fdb_kvs_handle *)0x116ffb;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_918._8_8_,logCallbackFunc,"transaction_test");
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f8f;
  fconfig = &fStack_658.config.encryption_key;
  pfStack_930 = (fdb_kvs_handle *)0x117025;
  fdb_open(&pfStack_900,"mvcc_test1",(fdb_config *)fconfig);
  pfStack_930 = (fdb_kvs_handle *)0x117038;
  fdb_open((fdb_file_handle **)(auStack_8f8 + 0x10),"mvcc_test1",(fdb_config *)fconfig);
  pfStack_930 = (fdb_kvs_handle *)0x11704d;
  fdb_kvs_open_default(pfStack_900,&pfStack_908,(fdb_kvs_config *)auStack_8d0);
  pfStack_930 = (fdb_kvs_handle *)0x11705e;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_8f8._16_8_,(fdb_kvs_handle **)(auStack_8f8 + 8),
             (fdb_kvs_config *)auStack_8d0);
  pfStack_930 = (fdb_kvs_handle *)0x11706b;
  fdb_begin_transaction(pfStack_900,'\x02');
  pfStack_930 = (fdb_kvs_handle *)0x117079;
  fdb_begin_transaction((fdb_file_handle *)auStack_8f8._16_8_,'\x02');
  lVar11 = 0;
  uVar14 = 0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x117099;
    sprintf(auStack_7b8 + 0x50,"key%d",uVar14 & 0xffffffff);
    pfStack_930 = (fdb_kvs_handle *)0x1170b1;
    sprintf((char *)&fStack_658,"meta%d",uVar14 & 0xffffffff);
    pfStack_930 = (fdb_kvs_handle *)0x1170c6;
    sprintf(auStack_8d0 + 0x18,"body%d",uVar14 & 0xffffffff);
    pfStack_930 = (fdb_kvs_handle *)0x1170d9;
    sVar3 = strlen(auStack_7b8 + 0x50);
    pfStack_930 = (fdb_kvs_handle *)0x1170ec;
    sVar4 = strlen((char *)&fStack_658);
    pfStack_930 = (fdb_kvs_handle *)0x1170f9;
    sVar5 = strlen(auStack_8d0 + 0x18);
    pfStack_930 = (fdb_kvs_handle *)0x11711b;
    fdb_doc_create((fdb_doc **)(auStack_7b8 + lVar11),auStack_7b8 + 0x50,sVar3,&fStack_658,sVar4,
                   auStack_8d0 + 0x18,sVar5);
    pfStack_930 = (fdb_kvs_handle *)0x11712d;
    fdb_set(pfStack_908,*(fdb_doc **)(auStack_7b8 + uVar14 * 8));
    uVar14 = uVar14 + 1;
    lVar11 = lVar11 + 8;
  } while (uVar14 != 5);
  uVar14 = 5;
  pfVar13 = (fdb_kvs_handle *)0x28;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x117164;
    sprintf(auStack_7b8 + 0x50,"key%d",uVar14 & 0xffffffff);
    pfStack_930 = (fdb_kvs_handle *)0x11717c;
    sprintf((char *)&fStack_658,"meta%d",uVar14 & 0xffffffff);
    pfStack_930 = (fdb_kvs_handle *)0x117191;
    sprintf(auStack_8d0 + 0x18,"body%d",uVar14 & 0xffffffff);
    pfVar12 = (fdb_kvs_handle *)(auStack_7b8 + (long)pfVar13);
    pfStack_930 = (fdb_kvs_handle *)0x1171a4;
    sVar3 = strlen(auStack_7b8 + 0x50);
    pfStack_930 = (fdb_kvs_handle *)0x1171b7;
    sVar4 = strlen((char *)&fStack_658);
    pfStack_930 = (fdb_kvs_handle *)0x1171c4;
    sVar5 = strlen(auStack_8d0 + 0x18);
    pfStack_930 = (fdb_kvs_handle *)0x1171e6;
    fdb_doc_create((fdb_doc **)pfVar12,auStack_7b8 + 0x50,sVar3,&fStack_658,sVar4,auStack_8d0 + 0x18
                   ,sVar5);
    pfStack_930 = (fdb_kvs_handle *)0x1171f8;
    fdb_set((fdb_kvs_handle *)auStack_8f8._8_8_,*(fdb_doc **)(auStack_7b8 + uVar14 * 8));
    uVar14 = uVar14 + 1;
    pfVar13 = (fdb_kvs_handle *)((long)pfVar13 + 8);
  } while (uVar14 != 10);
  pcVar10 = "key%d";
  config = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
  pfVar8 = (fdb_kvs_handle *)auStack_918;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x11722e;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_930 = (fdb_kvs_handle *)0x117236;
    sVar3 = strlen((char *)config);
    pfStack_930 = (fdb_kvs_handle *)0x117254;
    fdb_doc_create((fdb_doc **)pfVar8,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x117263;
    fVar2 = fdb_get(pfStack_908,(fdb_doc *)auStack_918._0_8_);
    if ((uint)doc_00 < 5) {
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f71;
    }
    else if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00117f76;
    pfStack_930 = (fdb_kvs_handle *)0x117283;
    fdb_doc_free((fdb_doc *)auStack_918._0_8_);
    uVar9 = (uint)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar9;
  } while (uVar9 != 10);
  pfStack_930 = (fdb_kvs_handle *)0x1172a6;
  fdb_open((fdb_file_handle **)(auStack_8f8 + 0x18),"mvcc_test1",
           (fdb_config *)&fStack_658.config.encryption_key);
  pfStack_930 = (fdb_kvs_handle *)0x1172b8;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_8f8._24_8_,(fdb_kvs_handle **)(auStack_8f8 + 0x20),
             (fdb_kvs_config *)auStack_8d0);
  pfStack_930 = (fdb_kvs_handle *)0x1172c5;
  fdb_begin_transaction((fdb_file_handle *)auStack_8f8._24_8_,'\x03');
  pcVar10 = auStack_7b8 + 0x50;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x1172ea;
    sprintf(pcVar10,"key%d",doc_00);
    pfStack_930 = (fdb_kvs_handle *)0x1172f2;
    sVar3 = strlen(pcVar10);
    pfStack_930 = (fdb_kvs_handle *)0x117310;
    fdb_doc_create((fdb_doc **)auStack_918,pcVar10,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x11731f;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_8f8._32_8_,(fdb_doc *)auStack_918._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_930 = (fdb_kvs_handle *)0x117ed9;
      transaction_test();
      goto LAB_00117ed9;
    }
    pfStack_930 = (fdb_kvs_handle *)0x117331;
    fdb_doc_free((fdb_doc *)auStack_918._0_8_);
    uVar9 = (int)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar9;
  } while (uVar9 != 10);
  pfStack_930 = (fdb_kvs_handle *)0x117344;
  fdb_end_transaction((fdb_file_handle *)auStack_8f8._24_8_,'\0');
  pfStack_930 = (fdb_kvs_handle *)0x11734e;
  fdb_close((fdb_file_handle *)auStack_8f8._24_8_);
  pfStack_930 = (fdb_kvs_handle *)0x11735a;
  fdb_end_transaction(pfStack_900,'\0');
  pcVar10 = "key%d";
  config = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
  pfVar8 = (fdb_kvs_handle *)auStack_918;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x11737f;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_930 = (fdb_kvs_handle *)0x117387;
    sVar3 = strlen((char *)config);
    pfStack_930 = (fdb_kvs_handle *)0x1173a5;
    fdb_doc_create((fdb_doc **)pfVar8,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x1173b4;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_918._8_8_,(fdb_doc *)auStack_918._0_8_);
    if ((uint)doc_00 < 5) {
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f7b;
    }
    else if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00117f80;
    pfStack_930 = (fdb_kvs_handle *)0x1173d4;
    fdb_doc_free((fdb_doc *)auStack_918._0_8_);
    uVar9 = (uint)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar9;
  } while (uVar9 != 10);
  config = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
  pfVar8 = (fdb_kvs_handle *)auStack_918;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x117400;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_930 = (fdb_kvs_handle *)0x117408;
    sVar3 = strlen((char *)config);
    pfStack_930 = (fdb_kvs_handle *)0x117426;
    fdb_doc_create((fdb_doc **)pfVar8,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x117435;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_8f8._8_8_,(fdb_doc *)auStack_918._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117ed9;
    pfStack_930 = (fdb_kvs_handle *)0x117447;
    fdb_doc_free((fdb_doc *)auStack_918._0_8_);
    uVar9 = (int)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar9;
  } while (uVar9 != 10);
  pfStack_930 = (fdb_kvs_handle *)0x117458;
  fdb_abort_transaction((fdb_file_handle *)auStack_8f8._16_8_);
  pfStack_930 = (fdb_kvs_handle *)0x117465;
  fdb_close((fdb_file_handle *)auStack_8f8._0_8_);
  pfStack_930 = (fdb_kvs_handle *)0x11747c;
  fdb_open((fdb_file_handle **)auStack_8f8,"mvcc_test1",
           (fdb_config *)&fStack_658.config.encryption_key);
  pcVar10 = auStack_918 + 8;
  pfStack_930 = (fdb_kvs_handle *)0x117491;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_8f8._0_8_,(fdb_kvs_handle **)pcVar10,
             (fdb_kvs_config *)auStack_8d0);
  pfStack_930 = (fdb_kvs_handle *)0x1174a7;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_918._8_8_,logCallbackFunc,"transaction_test");
  pcVar15 = (char *)pfVar12;
  handle = pfVar13;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f94;
  pcVar10 = "key%d";
  config = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
  pfVar8 = (fdb_kvs_handle *)auStack_918;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x1174d4;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_930 = (fdb_kvs_handle *)0x1174dc;
    sVar3 = strlen((char *)config);
    pfStack_930 = (fdb_kvs_handle *)0x1174fa;
    fdb_doc_create((fdb_doc **)pfVar8,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x117509;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_918._8_8_,(fdb_doc *)auStack_918._0_8_);
    if ((uint)doc_00 < 5) {
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f85;
    }
    else if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00117f8a;
    pfStack_930 = (fdb_kvs_handle *)0x117529;
    fdb_doc_free((fdb_doc *)auStack_918._0_8_);
    uVar9 = (uint)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar9;
  } while (uVar9 != 10);
  lVar11 = 0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x117544;
    fdb_set((fdb_kvs_handle *)auStack_918._8_8_,*(fdb_doc **)(auStack_7b8 + lVar11 * 8 + 0x28));
    lVar11 = lVar11 + 1;
  } while (lVar11 != 5);
  pfStack_930 = (fdb_kvs_handle *)0x117559;
  fdb_commit((fdb_file_handle *)auStack_8f8._0_8_,'\0');
  pcVar10 = auStack_7b8 + 0x50;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x11757e;
    sprintf(pcVar10,"key%d",doc_00);
    pfStack_930 = (fdb_kvs_handle *)0x117586;
    sVar3 = strlen(pcVar10);
    pfStack_930 = (fdb_kvs_handle *)0x1175a4;
    fdb_doc_create((fdb_doc **)auStack_918,pcVar10,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x1175b3;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_918._8_8_,(fdb_doc *)auStack_918._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117ede;
    pfStack_930 = (fdb_kvs_handle *)0x1175c5;
    fdb_doc_free((fdb_doc *)auStack_918._0_8_);
    uVar9 = (int)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar9;
  } while (uVar9 != 10);
  pfStack_930 = (fdb_kvs_handle *)0x1175db;
  fdb_begin_transaction(pfStack_900,'\x02');
  pfStack_930 = (fdb_kvs_handle *)0x1175ea;
  fdb_begin_transaction((fdb_file_handle *)auStack_8f8._16_8_,'\x02');
  uVar14 = 0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x117609;
    sprintf(auStack_7b8 + 0x50,"key%d",uVar14);
    doc_00 = &fStack_658;
    pfStack_930 = (fdb_kvs_handle *)0x117625;
    sprintf((char *)doc_00,"meta%d",uVar14);
    pcVar15 = auStack_8d0 + 0x18;
    pfStack_930 = (fdb_kvs_handle *)0x11763e;
    sprintf(pcVar15,"body%d_txn1",uVar14);
    pfStack_930 = (fdb_kvs_handle *)0x117646;
    sVar3 = strlen(auStack_7b8 + 0x50);
    pfStack_930 = (fdb_kvs_handle *)0x117651;
    sVar4 = strlen((char *)doc_00);
    pfStack_930 = (fdb_kvs_handle *)0x11765c;
    sVar5 = strlen(pcVar15);
    pcVar10 = auStack_7b8 + 0x50;
    pfStack_930 = (fdb_kvs_handle *)0x117681;
    fdb_doc_create((fdb_doc **)auStack_918,pcVar10,sVar3,doc_00,sVar4,pcVar15,sVar5);
    pfStack_930 = (fdb_kvs_handle *)0x117690;
    fdb_set(pfStack_908,(fdb_doc *)auStack_918._0_8_);
    pfStack_930 = (fdb_kvs_handle *)0x11769a;
    fdb_doc_free((fdb_doc *)auStack_918._0_8_);
    pfStack_930 = (fdb_kvs_handle *)0x1176ae;
    sprintf(pcVar15,"body%d_txn2",uVar14);
    pfStack_930 = (fdb_kvs_handle *)0x1176b6;
    sVar3 = strlen(pcVar10);
    pfStack_930 = (fdb_kvs_handle *)0x1176c1;
    sVar4 = strlen((char *)doc_00);
    pfStack_930 = (fdb_kvs_handle *)0x1176cc;
    sVar5 = strlen(pcVar15);
    pfStack_930 = (fdb_kvs_handle *)0x1176e9;
    fdb_doc_create((fdb_doc **)auStack_918,pcVar10,sVar3,doc_00,sVar4,pcVar15,sVar5);
    pfStack_930 = (fdb_kvs_handle *)0x1176f8;
    fdb_set((fdb_kvs_handle *)auStack_8f8._8_8_,(fdb_doc *)auStack_918._0_8_);
    pfStack_930 = (fdb_kvs_handle *)0x117702;
    fdb_doc_free((fdb_doc *)auStack_918._0_8_);
    uVar9 = (int)uVar14 + 1;
    uVar14 = (ulong)uVar9;
  } while (uVar9 != 10);
  pfVar13 = (fdb_kvs_handle *)auStack_918;
  handle = (fdb_kvs_handle *)(auStack_8d0 + 0x18);
  pcVar10 = (char *)0x0;
  do {
    config = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
    pfStack_930 = (fdb_kvs_handle *)0x117736;
    sprintf((char *)config,"key%d",(ulong)pcVar10 & 0xffffffff);
    pfStack_930 = (fdb_kvs_handle *)0x11773e;
    sVar3 = strlen((char *)config);
    pfStack_930 = (fdb_kvs_handle *)0x11775c;
    fdb_doc_create((fdb_doc **)pfVar13,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x11776b;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_918._8_8_,(fdb_doc *)auStack_918._0_8_);
    pfVar12 = (fdb_kvs_handle *)auStack_918._0_8_;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117eee;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_918._0_8_ + 0x40))->seqtree;
    pfVar8 = *(fdb_kvs_handle **)(*(long *)(auStack_7b8 + (long)pcVar10 * 8) + 0x40);
    pfStack_930 = (fdb_kvs_handle *)0x11779f;
    iVar6 = bcmp(doc_00,pfVar8,(size_t)((fdb_kvs_config *)auStack_918._0_8_)->custom_cmp_param);
    config = handle;
    if (iVar6 != 0) goto LAB_00117ee3;
    pfStack_930 = (fdb_kvs_handle *)0x1177af;
    fdb_doc_free((fdb_doc *)pfVar12);
    pcVar15 = auStack_7b8 + 0x50;
    pfStack_930 = (fdb_kvs_handle *)0x1177bf;
    sVar3 = strlen(pcVar15);
    pfStack_930 = (fdb_kvs_handle *)0x1177e0;
    fdb_doc_create((fdb_doc **)pfVar13,pcVar15,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x1177ef;
    fVar2 = fdb_get(pfStack_908,(fdb_doc *)auStack_918._0_8_);
    pfVar12 = pfVar13;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f00;
    pfStack_930 = (fdb_kvs_handle *)0x11780d;
    sprintf((char *)handle,"body%d_txn1",(ulong)pcVar10 & 0xffffffff);
    pcVar15 = (char *)auStack_918._0_8_;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_918._0_8_ + 0x40))->seqtree;
    pfStack_930 = (fdb_kvs_handle *)0x117827;
    iVar6 = bcmp(doc_00,handle,(size_t)((fdb_kvs_config *)auStack_918._0_8_)->custom_cmp_param);
    if (iVar6 != 0) goto LAB_00117ef3;
    pfStack_930 = (fdb_kvs_handle *)0x117837;
    fdb_doc_free((fdb_doc *)pcVar15);
    config = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
    pfStack_930 = (fdb_kvs_handle *)0x117847;
    sVar3 = strlen((char *)config);
    pfStack_930 = (fdb_kvs_handle *)0x117865;
    fdb_doc_create((fdb_doc **)pfVar13,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x117874;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_8f8._8_8_,(fdb_doc *)auStack_918._0_8_);
    pfVar8 = pfVar13;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f12;
    pfStack_930 = (fdb_kvs_handle *)0x11788f;
    sprintf((char *)handle,"body%d_txn2",(ulong)pcVar10 & 0xffffffff);
    pcVar15 = (char *)auStack_918._0_8_;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_918._0_8_ + 0x40))->seqtree;
    pfStack_930 = (fdb_kvs_handle *)0x1178a9;
    iVar6 = bcmp(doc_00,handle,(size_t)((fdb_kvs_config *)auStack_918._0_8_)->custom_cmp_param);
    if (iVar6 != 0) goto LAB_00117f05;
    pfStack_930 = (fdb_kvs_handle *)0x1178b9;
    fdb_doc_free((fdb_doc *)pcVar15);
    pcVar10 = &(((fdb_kvs_handle *)pcVar10)->kvs_config).field_0x1;
  } while (pcVar10 != (undefined1 *)0xa);
  pfStack_930 = (fdb_kvs_handle *)0x1178d2;
  fdb_end_transaction((fdb_file_handle *)auStack_8f8._16_8_,'\0');
  config = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
  pfVar8 = (fdb_kvs_handle *)auStack_918;
  handle = (fdb_kvs_handle *)(auStack_8d0 + 0x18);
  pcVar10 = (char *)0x0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x1178f9;
    sprintf((char *)config,"key%d",pcVar10);
    pfStack_930 = (fdb_kvs_handle *)0x117901;
    sVar3 = strlen((char *)config);
    pfStack_930 = (fdb_kvs_handle *)0x11791f;
    fdb_doc_create((fdb_doc **)pfVar8,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x11792e;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_918._8_8_,(fdb_doc *)auStack_918._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f24;
    pfStack_930 = (fdb_kvs_handle *)0x117949;
    sprintf((char *)handle,"body%d_txn2",pcVar10);
    pcVar15 = (char *)auStack_918._0_8_;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_918._0_8_ + 0x40))->seqtree;
    pfStack_930 = (fdb_kvs_handle *)0x117963;
    iVar6 = bcmp(doc_00,handle,(size_t)((fdb_kvs_config *)auStack_918._0_8_)->custom_cmp_param);
    if (iVar6 != 0) goto LAB_00117f17;
    pfStack_930 = (fdb_kvs_handle *)0x117973;
    fdb_doc_free((fdb_doc *)pcVar15);
    pfStack_930 = (fdb_kvs_handle *)0x11797b;
    sVar3 = strlen((char *)config);
    pfStack_930 = (fdb_kvs_handle *)0x117999;
    fdb_doc_create((fdb_doc **)pfVar8,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x1179a8;
    fVar2 = fdb_get(pfStack_908,(fdb_doc *)auStack_918._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f36;
    pfStack_930 = (fdb_kvs_handle *)0x1179c3;
    sprintf((char *)handle,"body%d_txn1",pcVar10);
    pcVar15 = (char *)auStack_918._0_8_;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_918._0_8_ + 0x40))->seqtree;
    pfStack_930 = (fdb_kvs_handle *)0x1179dd;
    iVar6 = bcmp(doc_00,handle,(size_t)((fdb_kvs_config *)auStack_918._0_8_)->custom_cmp_param);
    if (iVar6 != 0) goto LAB_00117f29;
    pfStack_930 = (fdb_kvs_handle *)0x1179ed;
    fdb_doc_free((fdb_doc *)pcVar15);
    uVar9 = (int)pcVar10 + 1;
    pcVar10 = (char *)(ulong)uVar9;
  } while (uVar9 != 10);
  pfStack_930 = (fdb_kvs_handle *)0x117a04;
  fdb_end_transaction(pfStack_900,'\0');
  config = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
  pcVar15 = "body%d_txn1";
  handle = (fdb_kvs_handle *)(auStack_8d0 + 0x18);
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x117a2d;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_930 = (fdb_kvs_handle *)0x117a35;
    sVar3 = strlen((char *)config);
    pfStack_930 = (fdb_kvs_handle *)0x117a55;
    fdb_doc_create((fdb_doc **)auStack_918,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x117a64;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_918._8_8_,(fdb_doc *)auStack_918._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f48;
    pfStack_930 = (fdb_kvs_handle *)0x117a7b;
    sprintf((char *)handle,"body%d_txn1",doc_00);
    pcVar10 = (char *)auStack_918._0_8_;
    pfVar8 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_918._0_8_ + 0x40))->seqtree;
    pfStack_930 = (fdb_kvs_handle *)0x117a93;
    iVar6 = bcmp(pfVar8,handle,(size_t)((fdb_kvs_config *)auStack_918._0_8_)->custom_cmp_param);
    if (iVar6 != 0) goto LAB_00117f3b;
    pfStack_930 = (fdb_kvs_handle *)0x117aa3;
    fdb_doc_free((fdb_doc *)pcVar10);
    uVar9 = (int)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar9;
  } while (uVar9 != 10);
  pfStack_930 = (fdb_kvs_handle *)0x117abd;
  fdb_begin_transaction(pfStack_900,'\x02');
  pfVar13 = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
  pfStack_930 = (fdb_kvs_handle *)0x117adb;
  sprintf((char *)pfVar13,"key%d",5);
  pfVar8 = &fStack_658;
  pfStack_930 = (fdb_kvs_handle *)0x117af9;
  sprintf((char *)pfVar8,"meta%d",5);
  pcVar15 = auStack_8d0 + 0x18;
  pfStack_930 = (fdb_kvs_handle *)0x117b14;
  sprintf(pcVar15,"body%d_before_compaction",5);
  pfStack_930 = (fdb_kvs_handle *)0x117b1c;
  handle = (fdb_kvs_handle *)strlen((char *)pfVar13);
  pfStack_930 = (fdb_kvs_handle *)0x117b27;
  doc_00 = (fdb_kvs_handle *)strlen((char *)pfVar8);
  pfStack_930 = (fdb_kvs_handle *)0x117b32;
  sVar3 = strlen(pcVar15);
  config = (fdb_kvs_handle *)auStack_918;
  pfStack_930 = (fdb_kvs_handle *)0x117b52;
  fdb_doc_create((fdb_doc **)config,pfVar13,(size_t)handle,pfVar8,(size_t)doc_00,pcVar15,sVar3);
  pfStack_930 = (fdb_kvs_handle *)0x117b5f;
  fdb_set(pfStack_908,(fdb_doc *)auStack_918._0_8_);
  pfStack_930 = (fdb_kvs_handle *)0x117b67;
  fdb_doc_free((fdb_doc *)auStack_918._0_8_);
  pfStack_930 = (fdb_kvs_handle *)0x117b78;
  fdb_compact((fdb_file_handle *)auStack_8f8._0_8_,"mvcc_test2");
  pfStack_930 = (fdb_kvs_handle *)0x117b80;
  sVar3 = strlen((char *)pfVar13);
  pfStack_930 = (fdb_kvs_handle *)0x117b9e;
  fdb_doc_create((fdb_doc **)config,pfVar13,sVar3,(void *)0x0,0,(void *)0x0,0);
  pfStack_930 = (fdb_kvs_handle *)0x117bab;
  fVar2 = fdb_get(pfStack_908,(fdb_doc *)auStack_918._0_8_);
  pcVar10 = (char *)auStack_918._0_8_;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f99;
  config = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_918._0_8_ + 0x40))->seqtree;
  pfStack_930 = (fdb_kvs_handle *)0x117bcd;
  iVar6 = bcmp(config,auStack_8d0 + 0x18,
               (size_t)((fdb_kvs_config *)auStack_918._0_8_)->custom_cmp_param);
  if (iVar6 != 0) goto LAB_00117f9e;
  pfStack_930 = (fdb_kvs_handle *)0x117bdd;
  fdb_doc_free((fdb_doc *)pcVar10);
  pcVar10 = auStack_7b8 + 0x50;
  pfStack_930 = (fdb_kvs_handle *)0x117bed;
  sVar3 = strlen(pcVar10);
  config = (fdb_kvs_handle *)auStack_918;
  pfStack_930 = (fdb_kvs_handle *)0x117c10;
  fdb_doc_create((fdb_doc **)config,pcVar10,sVar3,(void *)0x0,0,(void *)0x0,0);
  pfStack_930 = (fdb_kvs_handle *)0x117c1d;
  fVar2 = fdb_get((fdb_kvs_handle *)auStack_918._8_8_,(fdb_doc *)auStack_918._0_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117fab;
  pfVar8 = (fdb_kvs_handle *)(auStack_8d0 + 0x18);
  pfStack_930 = (fdb_kvs_handle *)0x117c40;
  sprintf((char *)pfVar8,"body%d_txn1",5);
  pcVar10 = (char *)auStack_918._0_8_;
  config = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_918._0_8_ + 0x40))->seqtree;
  pfStack_930 = (fdb_kvs_handle *)0x117c58;
  iVar6 = bcmp(config,pfVar8,(size_t)((fdb_kvs_config *)auStack_918._0_8_)->custom_cmp_param);
  if (iVar6 != 0) goto LAB_00117fb0;
  pfStack_930 = (fdb_kvs_handle *)0x117c68;
  fdb_doc_free((fdb_doc *)pcVar10);
  pfStack_930 = (fdb_kvs_handle *)0x117c74;
  fdb_end_transaction(pfStack_900,'\0');
  config = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
  pfVar8 = (fdb_kvs_handle *)auStack_918;
  handle = (fdb_kvs_handle *)(auStack_8d0 + 0x18);
  pcVar15 = (char *)0x0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x117c9d;
    sprintf((char *)config,"key%d",pcVar15);
    pfStack_930 = (fdb_kvs_handle *)0x117ca5;
    sVar3 = strlen((char *)config);
    pfStack_930 = (fdb_kvs_handle *)0x117cc3;
    fdb_doc_create((fdb_doc **)pfVar8,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x117cd2;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_918._8_8_,(fdb_doc *)auStack_918._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f5a;
    if ((int)pcVar15 == 5) {
      pcVar10 = "body%d_before_compaction";
      pfVar13 = (fdb_kvs_handle *)0x5;
    }
    else {
      pcVar10 = "body%d_txn1";
      pfVar13 = (fdb_kvs_handle *)pcVar15;
    }
    pfStack_930 = (fdb_kvs_handle *)0x117d02;
    sprintf((char *)handle,pcVar10,pfVar13);
    doc_00 = (fdb_kvs_handle *)auStack_918._0_8_;
    pcVar10 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_918._0_8_ + 0x40))
                      ->seqtree;
    pfStack_930 = (fdb_kvs_handle *)0x117d1a;
    iVar6 = bcmp(pcVar10,handle,(size_t)((fdb_kvs_config *)auStack_918._0_8_)->custom_cmp_param);
    if (iVar6 != 0) goto LAB_00117f4d;
    pfStack_930 = (fdb_kvs_handle *)0x117d2a;
    fdb_doc_free((fdb_doc *)doc_00);
    uVar9 = (int)pcVar15 + 1;
    pcVar15 = (char *)(ulong)uVar9;
  } while (uVar9 != 10);
  pfStack_930 = (fdb_kvs_handle *)0x117d44;
  fdb_close((fdb_file_handle *)auStack_8f8._0_8_);
  pfStack_930 = (fdb_kvs_handle *)0x117d5b;
  fdb_open((fdb_file_handle **)auStack_8f8,"mvcc_test2",
           (fdb_config *)&fStack_658.config.encryption_key);
  pcVar10 = auStack_918 + 8;
  pfStack_930 = (fdb_kvs_handle *)0x117d70;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_8f8._0_8_,(fdb_kvs_handle **)pcVar10,
             (fdb_kvs_config *)auStack_8d0);
  pfStack_930 = (fdb_kvs_handle *)0x117d86;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_918._8_8_,logCallbackFunc,"transaction_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    config = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
    pfVar8 = (fdb_kvs_handle *)auStack_918;
    handle = (fdb_kvs_handle *)(auStack_8d0 + 0x18);
    pcVar15 = (char *)0x0;
    while( true ) {
      pfStack_930 = (fdb_kvs_handle *)0x117db7;
      sprintf((char *)config,"key%d",pcVar15);
      pfStack_930 = (fdb_kvs_handle *)0x117dbf;
      sVar3 = strlen((char *)config);
      pfStack_930 = (fdb_kvs_handle *)0x117ddd;
      fdb_doc_create((fdb_doc **)pfVar8,config,sVar3,(void *)0x0,0,(void *)0x0,0);
      pfStack_930 = (fdb_kvs_handle *)0x117dec;
      fVar2 = fdb_get((fdb_kvs_handle *)auStack_918._8_8_,(fdb_doc *)auStack_918._0_8_);
      if (fVar2 != FDB_RESULT_SUCCESS) break;
      if ((int)pcVar15 == 5) {
        pcVar10 = "body%d_before_compaction";
        pfVar13 = (fdb_kvs_handle *)0x5;
      }
      else {
        pcVar10 = "body%d_txn1";
        pfVar13 = (fdb_kvs_handle *)pcVar15;
      }
      pfStack_930 = (fdb_kvs_handle *)0x117e1c;
      sprintf((char *)handle,pcVar10,pfVar13);
      doc_00 = (fdb_kvs_handle *)auStack_918._0_8_;
      pcVar10 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_918._0_8_ + 0x40)
                        )->seqtree;
      pfStack_930 = (fdb_kvs_handle *)0x117e34;
      iVar6 = bcmp(pcVar10,handle,(size_t)((fdb_kvs_config *)auStack_918._0_8_)->custom_cmp_param);
      if (iVar6 != 0) goto LAB_00117f5f;
      pfStack_930 = (fdb_kvs_handle *)0x117e44;
      fdb_doc_free((fdb_doc *)doc_00);
      uVar9 = (int)pcVar15 + 1;
      pcVar15 = (char *)(ulong)uVar9;
      if (uVar9 == 10) {
        pfStack_930 = (fdb_kvs_handle *)0x117e5b;
        fdb_close((fdb_file_handle *)auStack_8f8._0_8_);
        pfStack_930 = (fdb_kvs_handle *)0x117e65;
        fdb_close(pfStack_900);
        pfStack_930 = (fdb_kvs_handle *)0x117e6f;
        fdb_close((fdb_file_handle *)auStack_8f8._16_8_);
        lVar11 = 0;
        do {
          pfStack_930 = (fdb_kvs_handle *)0x117e7e;
          fdb_doc_free(*(fdb_doc **)(auStack_7b8 + lVar11 * 8));
          lVar11 = lVar11 + 1;
        } while (lVar11 != 10);
        pfStack_930 = (fdb_kvs_handle *)0x117e8c;
        fdb_shutdown();
        pfStack_930 = (fdb_kvs_handle *)0x117e91;
        memleak_end();
        pcVar10 = "%s PASSED\n";
        if (transaction_test()::__test_pass != '\0') {
          pcVar10 = "%s FAILED\n";
        }
        pfStack_930 = (fdb_kvs_handle *)0x117ec2;
        fprintf(_stderr,pcVar10,"transaction test");
        return;
      }
    }
    goto LAB_00117f6c;
  }
  goto LAB_00117fbd;
LAB_001185e9:
  pfStack_cc8 = (fdb_kvs_handle *)0x1185f6;
  transaction_simple_api_test();
  pfVar12 = pfVar13;
LAB_001185f6:
  pfStack_cc8 = (fdb_kvs_handle *)0x1185fb;
  transaction_simple_api_test();
LAB_001185fb:
  pfStack_cc8 = (fdb_kvs_handle *)0x118608;
  transaction_simple_api_test();
  pfVar13 = pfVar12;
LAB_00118608:
  pfStack_cc8 = (fdb_kvs_handle *)0x11860d;
  transaction_simple_api_test();
LAB_0011860d:
  pfStack_cc8 = (fdb_kvs_handle *)0x11861a;
  transaction_simple_api_test();
  pfVar8 = pfVar13;
LAB_0011861a:
  pfStack_cc8 = (fdb_kvs_handle *)0x11861f;
  transaction_simple_api_test();
LAB_0011861f:
  pfStack_cc8 = (fdb_kvs_handle *)0x11862c;
  transaction_simple_api_test();
  pfVar13 = pfVar8;
LAB_0011862c:
  pfVar8 = pfVar13;
  pfStack_cc8 = (fdb_kvs_handle *)0x118631;
  transaction_simple_api_test();
LAB_00118631:
  pfStack_cc8 = (fdb_kvs_handle *)0x118636;
  transaction_simple_api_test();
LAB_00118636:
  pfVar12 = pfVar8;
  pfStack_cc8 = (fdb_kvs_handle *)0x11863b;
  transaction_simple_api_test();
LAB_0011863b:
  pfStack_cc8 = (fdb_kvs_handle *)0x118648;
  transaction_simple_api_test();
LAB_00118648:
  pfVar8 = (fdb_kvs_handle *)auStack_c50;
  pfStack_cc8 = (fdb_kvs_handle *)0x118655;
  transaction_simple_api_test();
  pfVar13 = (fdb_kvs_handle *)pcVar15;
  goto LAB_00118655;
LAB_00117ed9:
  pfStack_930 = (fdb_kvs_handle *)0x117ede;
  transaction_test();
LAB_00117ede:
  pfVar8 = (fdb_kvs_handle *)auStack_918;
  config = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
  pcVar10 = "key%d";
  pfStack_930 = (fdb_kvs_handle *)0x117ee3;
  transaction_test();
LAB_00117ee3:
  pfStack_930 = (fdb_kvs_handle *)0x117eee;
  transaction_test();
  pcVar15 = (char *)pfVar12;
  handle = pfVar13;
  pfVar13 = pfVar8;
LAB_00117eee:
  pfStack_930 = (fdb_kvs_handle *)0x117ef3;
  transaction_test();
LAB_00117ef3:
  pfStack_930 = (fdb_kvs_handle *)0x117f00;
  transaction_test();
  pfVar12 = handle;
LAB_00117f00:
  handle = pfVar12;
  pfStack_930 = (fdb_kvs_handle *)0x117f05;
  transaction_test();
  pfVar8 = pfVar13;
LAB_00117f05:
  pfStack_930 = (fdb_kvs_handle *)0x117f12;
  transaction_test();
LAB_00117f12:
  pfStack_930 = (fdb_kvs_handle *)0x117f17;
  transaction_test();
LAB_00117f17:
  pfStack_930 = (fdb_kvs_handle *)0x117f24;
  transaction_test();
LAB_00117f24:
  pfStack_930 = (fdb_kvs_handle *)0x117f29;
  transaction_test();
LAB_00117f29:
  pfStack_930 = (fdb_kvs_handle *)0x117f36;
  transaction_test();
LAB_00117f36:
  pfStack_930 = (fdb_kvs_handle *)0x117f3b;
  transaction_test();
LAB_00117f3b:
  pfStack_930 = (fdb_kvs_handle *)0x117f48;
  transaction_test();
LAB_00117f48:
  pfStack_930 = (fdb_kvs_handle *)0x117f4d;
  transaction_test();
LAB_00117f4d:
  pfStack_930 = (fdb_kvs_handle *)0x117f5a;
  transaction_test();
LAB_00117f5a:
  pfStack_930 = (fdb_kvs_handle *)0x117f5f;
  transaction_test();
LAB_00117f5f:
  pfStack_930 = (fdb_kvs_handle *)0x117f6c;
  transaction_test();
LAB_00117f6c:
  pfStack_930 = (fdb_kvs_handle *)0x117f71;
  transaction_test();
  pfVar12 = (fdb_kvs_handle *)pcVar15;
  pfVar13 = handle;
LAB_00117f71:
  pfStack_930 = (fdb_kvs_handle *)0x117f76;
  transaction_test();
LAB_00117f76:
  pfStack_930 = (fdb_kvs_handle *)0x117f7b;
  transaction_test();
LAB_00117f7b:
  pfStack_930 = (fdb_kvs_handle *)0x117f80;
  transaction_test();
LAB_00117f80:
  pfStack_930 = (fdb_kvs_handle *)0x117f85;
  transaction_test();
LAB_00117f85:
  pfStack_930 = (fdb_kvs_handle *)0x117f8a;
  transaction_test();
LAB_00117f8a:
  pfStack_930 = (fdb_kvs_handle *)0x117f8f;
  transaction_test();
LAB_00117f8f:
  pfStack_930 = (fdb_kvs_handle *)0x117f94;
  transaction_test();
  pcVar15 = (char *)pfVar12;
  handle = pfVar13;
LAB_00117f94:
  pfStack_930 = (fdb_kvs_handle *)0x117f99;
  transaction_test();
  pfVar13 = (fdb_kvs_handle *)pcVar10;
LAB_00117f99:
  pcVar10 = (char *)pfVar13;
  pfStack_930 = (fdb_kvs_handle *)0x117f9e;
  transaction_test();
LAB_00117f9e:
  pfStack_930 = (fdb_kvs_handle *)0x117fab;
  transaction_test();
LAB_00117fab:
  pfStack_930 = (fdb_kvs_handle *)0x117fb0;
  transaction_test();
LAB_00117fb0:
  pfStack_930 = (fdb_kvs_handle *)0x117fbd;
  transaction_test();
LAB_00117fbd:
  pfStack_930 = (fdb_kvs_handle *)transaction_simple_api_test;
  transaction_test();
  pfStack_cc8 = (fdb_kvs_handle *)0x117fdf;
  pfStack_958 = (fdb_kvs_handle *)pcVar10;
  pfStack_950 = (fdb_kvs_handle *)pcVar15;
  pfStack_948 = handle;
  pfStack_940 = config;
  pfStack_938 = pfVar8;
  pfStack_930 = doc_00;
  gettimeofday(&tStack_c60,(__timezone_ptr_t)0x0);
  pfStack_cc8 = (fdb_kvs_handle *)0x117fe4;
  memleak_start();
  pfStack_cc8 = (fdb_kvs_handle *)0x117ff0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_cc8 = (fdb_kvs_handle *)0x118000;
  fdb_get_default_config();
  config_00 = &fStack_c78;
  pfStack_cc8 = (fdb_kvs_handle *)0x11800d;
  fdb_get_default_kvs_config();
  fStack_a50.buffercache_size = 0;
  fStack_a50.wal_threshold = 0x400;
  fStack_a50.flags = 1;
  fStack_a50.purging_interval = 0;
  fStack_a50.compaction_threshold = '\0';
  pfVar13 = (fdb_kvs_handle *)&phStack_c80;
  pfStack_cc8 = (fdb_kvs_handle *)0x118046;
  fdb_open((fdb_file_handle **)pfVar13,"./mvcc_test1",&fStack_a50);
  pfVar12 = (fdb_kvs_handle *)&pfStack_ca8;
  pfStack_cc8 = (fdb_kvs_handle *)0x118059;
  fdb_kvs_open_default((fdb_file_handle *)phStack_c80,(fdb_kvs_handle **)pfVar12,config_00);
  pfStack_cc8 = (fdb_kvs_handle *)0x11806f;
  pfVar8 = pfStack_ca8;
  fVar2 = fdb_set_log_callback(pfStack_ca8,logCallbackFunc,"transaction_simple_api_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar10 = auStack_c50 + 0x100;
    pcVar15 = "body%d";
    doc_00 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_cc8 = (fdb_kvs_handle *)0x1180a0;
      sprintf(pcVar10,"key%d",doc_00);
      pfStack_cc8 = (fdb_kvs_handle *)0x1180af;
      sprintf(auStack_c50,"body%d",doc_00);
      handle = pfStack_ca8;
      pfStack_cc8 = (fdb_kvs_handle *)0x1180bc;
      pfVar13 = (fdb_kvs_handle *)strlen(pcVar10);
      pfStack_cc8 = (fdb_kvs_handle *)0x1180c7;
      sVar3 = strlen(auStack_c50);
      pfStack_cc8 = (fdb_kvs_handle *)0x1180db;
      fVar2 = fdb_set_kv(handle,pcVar10,(size_t)pfVar13,auStack_c50,sVar3);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_cc8 = (fdb_kvs_handle *)0x1185e9;
        transaction_simple_api_test();
        goto LAB_001185e9;
      }
      uVar9 = (int)doc_00 + 1;
      doc_00 = (fdb_kvs_handle *)(ulong)uVar9;
    } while (uVar9 != 10);
    pfStack_cc8 = (fdb_kvs_handle *)0x1180f6;
    fdb_commit((fdb_file_handle *)phStack_c80,'\0');
    pfStack_cc8 = (fdb_kvs_handle *)0x118118;
    fdb_open((fdb_file_handle **)&phStack_c88,"./mvcc_test1",&fStack_a50);
    pfStack_cc8 = (fdb_kvs_handle *)0x11812b;
    fdb_open((fdb_file_handle **)&pkStack_c90,"./mvcc_test1",&fStack_a50);
    pfStack_cc8 = (fdb_kvs_handle *)0x118140;
    fdb_kvs_open_default((fdb_file_handle *)phStack_c88,&pfStack_c98,&fStack_c78);
    pfStack_cc8 = (fdb_kvs_handle *)0x118151;
    fdb_kvs_open_default((fdb_file_handle *)pkStack_c90,&pfStack_ca0,&fStack_c78);
    pfStack_cc8 = (fdb_kvs_handle *)0x11815e;
    fdb_begin_transaction((fdb_file_handle *)phStack_c88,'\x02');
    pfStack_cc8 = (fdb_kvs_handle *)0x11816c;
    fdb_begin_transaction((fdb_file_handle *)pkStack_c90,'\x02');
    pcVar10 = auStack_c50 + 0x100;
    uVar9 = 0;
    do {
      pfStack_cc8 = (fdb_kvs_handle *)0x118191;
      sprintf(pcVar10,"key%d",(ulong)uVar9);
      pfStack_cc8 = (fdb_kvs_handle *)0x1181a4;
      sprintf(auStack_c50,"body%d_txn1",(ulong)uVar9);
      pfVar13 = pfStack_c98;
      pfStack_cc8 = (fdb_kvs_handle *)0x1181b1;
      sVar3 = strlen(pcVar10);
      pfStack_cc8 = (fdb_kvs_handle *)0x1181bc;
      sVar4 = strlen(auStack_c50);
      pfStack_cc8 = (fdb_kvs_handle *)0x1181d0;
      fdb_set_kv(pfVar13,pcVar10,sVar3,auStack_c50,sVar4);
      pfStack_cc8 = (fdb_kvs_handle *)0x1181df;
      sprintf(pcVar10,"key%d",(ulong)uVar9);
      pfStack_cc8 = (fdb_kvs_handle *)0x1181f2;
      sprintf(auStack_c50,"body%d_txn2",(ulong)uVar9);
      pfVar13 = pfStack_ca0;
      pfStack_cc8 = (fdb_kvs_handle *)0x1181ff;
      sVar3 = strlen(pcVar10);
      pfStack_cc8 = (fdb_kvs_handle *)0x11820a;
      sVar4 = strlen(auStack_c50);
      pfStack_cc8 = (fdb_kvs_handle *)0x11821e;
      fdb_set_kv(pfVar13,pcVar10,sVar3,auStack_c50,sVar4);
      uVar9 = uVar9 + 1;
    } while (uVar9 != 10);
    pcVar10 = auStack_c50 + 0x100;
    handle = (fdb_kvs_handle *)&pfStack_cb8;
    doc_00 = (fdb_kvs_handle *)&p_Stack_cb0;
    pcVar15 = (char *)0x0;
    do {
      pfStack_cc8 = (fdb_kvs_handle *)0x118257;
      sprintf(pcVar10,"key%d",pcVar15);
      pfStack_cc8 = (fdb_kvs_handle *)0x11826b;
      sprintf(auStack_c50,"body%d",pcVar15);
      pfVar12 = pfStack_ca8;
      pfStack_cc8 = (fdb_kvs_handle *)0x118278;
      sVar3 = strlen(pcVar10);
      pfStack_cc8 = (fdb_kvs_handle *)0x11828c;
      fVar2 = fdb_get_kv(pfVar12,pcVar10,sVar3,(void **)handle,(size_t *)doc_00);
      pfVar13 = pfStack_cb8;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001185f6;
      pfStack_cc8 = (fdb_kvs_handle *)0x1182a9;
      iVar6 = bcmp(pfStack_cb8,auStack_c50,(size_t)p_Stack_cb0);
      if (iVar6 != 0) goto LAB_001185e9;
      pfStack_cc8 = (fdb_kvs_handle *)0x1182b9;
      fdb_free_block(pfVar13);
      pfStack_cc8 = (fdb_kvs_handle *)0x1182cd;
      sprintf(pcVar10,"key%d",pcVar15);
      pfStack_cc8 = (fdb_kvs_handle *)0x1182e1;
      sprintf(auStack_c50,"body%d_txn1",pcVar15);
      pfVar13 = pfStack_c98;
      pfStack_cc8 = (fdb_kvs_handle *)0x1182ee;
      sVar3 = strlen(pcVar10);
      pfStack_cc8 = (fdb_kvs_handle *)0x118302;
      fVar2 = fdb_get_kv(pfVar13,pcVar10,sVar3,(void **)handle,(size_t *)doc_00);
      pfVar12 = pfStack_cb8;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00118608;
      pfStack_cc8 = (fdb_kvs_handle *)0x11831f;
      iVar6 = bcmp(pfStack_cb8,auStack_c50,(size_t)p_Stack_cb0);
      if (iVar6 != 0) goto LAB_001185fb;
      pfStack_cc8 = (fdb_kvs_handle *)0x11832f;
      fdb_free_block(pfVar12);
      pfStack_cc8 = (fdb_kvs_handle *)0x118343;
      sprintf(pcVar10,"key%d",pcVar15);
      pfStack_cc8 = (fdb_kvs_handle *)0x118357;
      sprintf(auStack_c50,"body%d_txn2",pcVar15);
      pfVar8 = pfStack_ca0;
      pfStack_cc8 = (fdb_kvs_handle *)0x118364;
      sVar3 = strlen(pcVar10);
      pfStack_cc8 = (fdb_kvs_handle *)0x118378;
      fVar2 = fdb_get_kv(pfVar8,pcVar10,sVar3,(void **)handle,(size_t *)doc_00);
      pfVar13 = pfStack_cb8;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011861a;
      pfStack_cc8 = (fdb_kvs_handle *)0x118395;
      iVar6 = bcmp(pfStack_cb8,auStack_c50,(size_t)p_Stack_cb0);
      if (iVar6 != 0) goto LAB_0011860d;
      pfStack_cc8 = (fdb_kvs_handle *)0x1183a5;
      fdb_free_block(pfVar13);
      uVar9 = (int)pcVar15 + 1;
      pcVar15 = (char *)(ulong)uVar9;
    } while (uVar9 != 10);
    pfStack_cc8 = (fdb_kvs_handle *)0x1183be;
    fdb_end_transaction((fdb_file_handle *)phStack_c88,'\0');
    pcVar10 = auStack_c50 + 0x100;
    handle = (fdb_kvs_handle *)&pfStack_cb8;
    doc_00 = (fdb_kvs_handle *)&p_Stack_cb0;
    pcVar15 = (char *)0x0;
    do {
      pfStack_cc8 = (fdb_kvs_handle *)0x1183ec;
      sprintf(pcVar10,"key%d",pcVar15);
      pfStack_cc8 = (fdb_kvs_handle *)0x118400;
      sprintf(auStack_c50,"body%d_txn1",pcVar15);
      pfVar13 = pfStack_ca8;
      pfStack_cc8 = (fdb_kvs_handle *)0x11840d;
      sVar3 = strlen(pcVar10);
      pfStack_cc8 = (fdb_kvs_handle *)0x118421;
      fVar2 = fdb_get_kv(pfVar13,pcVar10,sVar3,(void **)handle,(size_t *)doc_00);
      pfVar8 = pfStack_cb8;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011862c;
      pfStack_cc8 = (fdb_kvs_handle *)0x11843e;
      iVar6 = bcmp(pfStack_cb8,auStack_c50,(size_t)p_Stack_cb0);
      if (iVar6 != 0) goto LAB_0011861f;
      pfStack_cc8 = (fdb_kvs_handle *)0x11844e;
      fVar2 = fdb_free_block(pfVar8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00118631;
      pfStack_cc8 = (fdb_kvs_handle *)0x11846a;
      sprintf(pcVar10,"key%d",pcVar15);
      pfStack_cc8 = (fdb_kvs_handle *)0x11847e;
      sprintf(auStack_c50,"body%d_txn2",pcVar15);
      pfVar8 = pfStack_ca0;
      pfStack_cc8 = (fdb_kvs_handle *)0x11848b;
      sVar3 = strlen(pcVar10);
      pfStack_cc8 = (fdb_kvs_handle *)0x11849f;
      fVar2 = fdb_get_kv(pfVar8,pcVar10,sVar3,(void **)handle,(size_t *)doc_00);
      pfVar12 = pfStack_cb8;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00118636;
      pfStack_cc8 = (fdb_kvs_handle *)0x1184bc;
      iVar6 = bcmp(pfStack_cb8,auStack_c50,(size_t)p_Stack_cb0);
      if (iVar6 != 0) goto LAB_0011863b;
      pfStack_cc8 = (fdb_kvs_handle *)0x1184cc;
      fdb_free_block(pfVar12);
      uVar9 = (int)pcVar15 + 1;
      pcVar15 = (char *)(ulong)uVar9;
    } while (uVar9 != 10);
    pfStack_cc8 = (fdb_kvs_handle *)0x1184e5;
    fdb_end_transaction((fdb_file_handle *)pkStack_c90,'\0');
    pcVar10 = auStack_c50 + 0x100;
    handle = (fdb_kvs_handle *)&pfStack_cb8;
    doc_00 = (fdb_kvs_handle *)&p_Stack_cb0;
    pfVar12 = (fdb_kvs_handle *)0x0;
    while( true ) {
      pfStack_cc8 = (fdb_kvs_handle *)0x118511;
      sprintf(pcVar10,"key%d",pfVar12);
      pfStack_cc8 = (fdb_kvs_handle *)0x118524;
      sprintf(auStack_c50,"body%d_txn2",pfVar12);
      pfVar13 = pfStack_ca8;
      pfStack_cc8 = (fdb_kvs_handle *)0x118531;
      sVar3 = strlen(pcVar10);
      pfStack_cc8 = (fdb_kvs_handle *)0x118545;
      pfVar8 = pfVar13;
      fVar2 = fdb_get_kv(pfVar13,pcVar10,sVar3,(void **)handle,(size_t *)doc_00);
      pcVar15 = (char *)pfStack_cb8;
      if (fVar2 != FDB_RESULT_SUCCESS) break;
      pfStack_cc8 = (fdb_kvs_handle *)0x118562;
      iVar6 = bcmp(pfStack_cb8,auStack_c50,(size_t)p_Stack_cb0);
      if (iVar6 != 0) goto LAB_00118648;
      pfStack_cc8 = (fdb_kvs_handle *)0x118572;
      fdb_free_block(pcVar15);
      uVar9 = (int)pfVar12 + 1;
      pfVar12 = (fdb_kvs_handle *)(ulong)uVar9;
      if (uVar9 == 10) {
        pfStack_cc8 = (fdb_kvs_handle *)0x118583;
        fdb_close((fdb_file_handle *)phStack_c80);
        pfStack_cc8 = (fdb_kvs_handle *)0x11858d;
        fdb_close((fdb_file_handle *)phStack_c88);
        pfStack_cc8 = (fdb_kvs_handle *)0x118597;
        fdb_close((fdb_file_handle *)pkStack_c90);
        pfStack_cc8 = (fdb_kvs_handle *)0x11859c;
        fdb_shutdown();
        pfStack_cc8 = (fdb_kvs_handle *)0x1185a1;
        memleak_end();
        pcVar10 = "%s PASSED\n";
        if (transaction_simple_api_test()::__test_pass != '\0') {
          pcVar10 = "%s FAILED\n";
        }
        pfStack_cc8 = (fdb_kvs_handle *)0x1185d2;
        fprintf(_stderr,pcVar10,"transaction simple API test");
        return;
      }
    }
LAB_00118655:
    config_00 = (fdb_kvs_config *)(auStack_c50 + 0x100);
    pcVar15 = auStack_c50;
    pfStack_cc8 = (fdb_kvs_handle *)0x11865a;
    transaction_simple_api_test();
  }
  pfStack_cc8 = (fdb_kvs_handle *)in_memory_snapshot_thread;
  transaction_simple_api_test();
  pfStack_cf0 = pfVar12;
  pfStack_ce8 = (fdb_kvs_handle *)pcVar15;
  pfStack_ce0 = handle;
  pfStack_cd8 = config_00;
  pfStack_cd0 = pfVar13;
  pfStack_cc8 = doc_00;
  gettimeofday(&tStack_f08,(__timezone_ptr_t)0x0);
  fVar2 = fdb_snapshot_open(pfVar8,&pfStack_f10,0xffffffffffffffff);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdb6);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdb6,"void *in_memory_snapshot_thread(void *)");
  }
  fVar2 = fdb_iterator_init(pfStack_f10,&pfStack_f20,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdba);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdba,"void *in_memory_snapshot_thread(void *)");
  }
  uVar14 = 0;
  do {
    uVar9 = (uint)uVar14;
    pfStack_f18 = (fdb_doc *)0x0;
    fVar2 = fdb_iterator_get(pfStack_f20,&pfStack_f18);
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    sprintf(acStack_df8,"key%d",uVar14);
    sprintf(acStack_ef8,"body%d",uVar14);
    doc = pfStack_f18;
    pvVar1 = pfStack_f18->key;
    iVar6 = bcmp(pvVar1,acStack_df8,pfStack_f18->keylen);
    if (iVar6 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",acStack_df8,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdc4);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc4,"void *in_memory_snapshot_thread(void *)");
    }
    pvVar1 = doc->body;
    iVar6 = bcmp(pvVar1,acStack_ef8,doc->bodylen);
    if (iVar6 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",acStack_ef8,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdc5);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc5,"void *in_memory_snapshot_thread(void *)");
    }
    uVar9 = uVar9 + 1;
    uVar14 = (ulong)uVar9;
    fdb_doc_free(doc);
    fVar2 = fdb_iterator_next(pfStack_f20);
  } while (fVar2 == FDB_RESULT_SUCCESS);
  if (uVar9 != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdc9);
    __assert_fail("i == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdc9,"void *in_memory_snapshot_thread(void *)");
  }
  fVar2 = fdb_iterator_close(pfStack_f20);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdcc);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdcc,"void *in_memory_snapshot_thread(void *)");
  }
  fVar2 = fdb_kvs_close(pfStack_f10);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdce);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdce,"void *in_memory_snapshot_thread(void *)");
  }
  pthread_exit((void *)0x0);
}

Assistant:

void rollback_and_snapshot_test()
{
    TEST_INIT();

    memleak_start();

    fdb_seqnum_t seqnum, rollback_seqnum;
    fdb_kvs_info kvs_info;
    fdb_status status;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db,  *snapshot;
    int r;

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // MB-12530 open db
    config = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_open(&dbfile, "mvcc_test", &config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // 2. Create Key 'a' and Commit
    status = fdb_set_kv(db, (void *) "a", 1, (void *)"val-a", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // 3. Create Key 'b' and Commit
    status = fdb_set_kv(db, (void *)"b", 1, (void *)"val-b", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    seqnum = kvs_info.last_seqnum;

    // 4.  Remember this as our rollback point
    rollback_seqnum = seqnum;

    // 5. Create Key 'c' and Commit
    status = fdb_set_kv(db, (void *)"c", 1,(void *) "val-c", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // 6. Rollback to rollback point (seq 2)
    status = fdb_rollback(&db, rollback_seqnum);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    seqnum = kvs_info.last_seqnum;

    // 7. Verify that Key 'c' is not found
    void *val;
    size_t vallen;
    status = fdb_get_kv(db, (void *)"c", 1, &val, &vallen);
    TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);

    // 8. Open a snapshot at the same point
    status = fdb_snapshot_open(db, &snapshot, seqnum);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // 9. Verify that Key 'c' is not found
    status = fdb_get_kv(snapshot, (void *)"c", 1, &val, &vallen);
    TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);

    // close the snapshot db
    fdb_kvs_close(snapshot);

    // close db file
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("rollback and snapshot test");
}